

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_gray(Mat *m,uchar *gray,int stride)

{
  int *piVar1;
  int in_EDX;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  int remain;
  int y;
  float *ptr;
  int wgap;
  int h;
  int w;
  int local_44 [3];
  int local_38;
  int local_34;
  float *local_30;
  int local_28;
  int local_24;
  int local_20;
  undefined1 *local_18;
  
  local_20 = *(int *)((long)in_RDI + 0x2c);
  local_24 = *(int *)(in_RDI + 6);
  local_28 = in_EDX - local_20;
  if (local_28 == 0) {
    local_20 = local_20 * local_24;
    local_24 = 1;
  }
  local_30 = (float *)*in_RDI;
  local_18 = in_RSI;
  for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
    for (local_38 = local_20; 0 < local_38; local_38 = local_38 + -1) {
      local_44[2] = (int)*local_30;
      local_44[1] = 0;
      piVar1 = std::max<int>(local_44 + 2,local_44 + 1);
      local_44[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_44);
      *local_18 = (char)*piVar1;
      local_18 = local_18 + 1;
      local_30 = local_30 + 1;
    }
    local_18 = local_18 + local_28;
  }
  return;
}

Assistant:

static void to_gray(const Mat& m, unsigned char* gray, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr = m;

    for (int y = 0; y < h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
        for (; nn > 0; nn--)
        {
            float32x4_t _glow = vld1q_f32(ptr);
            float32x4_t _ghigh = vld1q_f32(ptr + 4);

            int16x8_t _g16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_glow)), vmovn_s32(vcvtq_s32_f32(_ghigh)));

            uint8x8_t _gray = vqmovun_s16(_g16);

            vst1_u8(gray, _gray);

            gray += 8;
            ptr += 8;
        }
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            *gray = SATURATE_CAST_UCHAR(*ptr);

            gray++;
            ptr++;
        }

#undef SATURATE_CAST_UCHAR
        gray += wgap;
    }
}